

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O0

void __thiscall cmDocumentation::~cmDocumentation(cmDocumentation *this)

{
  cmDocumentation *this_local;
  
  cmDeleteAll<std::map<std::__cxx11::string,cmDocumentationSection*,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,cmDocumentationSection*>>>>
            (&this->AllSections);
  cmDocumentationFormatter::~cmDocumentationFormatter(&this->Formatter);
  std::
  vector<cmDocumentation::RequestedHelpItem,_std::allocator<cmDocumentation::RequestedHelpItem>_>::
  ~vector(&this->RequestedHelpItems);
  std::__cxx11::string::~string((string *)&this->CurrentArgument);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmDocumentationSection_*>_>_>
  ::~map(&this->AllSections);
  std::__cxx11::string::~string((string *)&this->NameString);
  return;
}

Assistant:

cmDocumentation::~cmDocumentation()
{
  cmDeleteAll(this->AllSections);
}